

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O3

bool __thiscall
libtorrent::anon_unknown_0::ut_metadata_peer_plugin::on_extension_handshake
          (ut_metadata_peer_plugin *this,bdecode_node *h)

{
  undefined1 *puVar1;
  ut_metadata_plugin *puVar2;
  bool bVar3;
  type_t tVar4;
  int64_t iVar5;
  char *p;
  uint uVar6;
  string_view key;
  string_view key_00;
  string_view key_01;
  bdecode_node messages;
  bdecode_node local_60;
  
  this->m_message_index = 0;
  tVar4 = bdecode_node::type(h);
  if (tVar4 != dict_t) {
    return false;
  }
  key_01.len_ = 1;
  key_01.ptr_ = "m";
  bdecode_node::dict_find_dict(&local_60,h,key_01);
  bVar3 = bdecode_node::operator_cast_to_bool(&local_60);
  if (bVar3) {
    key.len_ = 0xb;
    key.ptr_ = "ut_metadata";
    iVar5 = bdecode_node::dict_find_int_value(&local_60,key,-1);
    if ((int)iVar5 != -1) {
      this->m_message_index = (int)iVar5;
      key_00.len_ = 0xd;
      key_00.ptr_ = "metadata_size";
      iVar5 = bdecode_node::dict_find_int_value(h,key_00,0);
      uVar6 = (uint)iVar5;
      if ((int)uVar6 < 1) {
        puVar1 = &(this->m_pc->super_peer_connection).field_0x763;
        *puVar1 = *puVar1 & 0xfb;
      }
      else if ((uVar6 < 0x400001) && (puVar2 = this->m_tp, puVar2->m_metadata_size < 1)) {
        puVar2->m_metadata_size = uVar6;
        p = (char *)operator_new__((ulong)(uVar6 & 0x7fffff));
        boost::shared_array<char>::reset<char>(&puVar2->m_metadata,p);
        aux::
        container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
        ::resize<int,void>((container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
                            *)&puVar2->m_requested_metadata,uVar6 + 0x3fff >> 0xe);
      }
      bVar3 = true;
      maybe_send_request(this);
      goto LAB_0033de71;
    }
  }
  bVar3 = false;
LAB_0033de71:
  if (local_60.m_tokens.
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.m_tokens.
                    super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    .
                    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool on_extension_handshake(bdecode_node const& h) override
		{
			m_message_index = 0;
			if (h.type() != bdecode_node::dict_t) return false;
			bdecode_node const messages = h.dict_find_dict("m");
			if (!messages) return false;

			int index = int(messages.dict_find_int_value("ut_metadata", -1));
			if (index == -1) return false;
			m_message_index = index;

			int metadata_size = int(h.dict_find_int_value("metadata_size"));
			if (metadata_size > 0)
				m_tp.metadata_size(metadata_size);
			else
				m_pc.set_has_metadata(false);

			maybe_send_request();
			return true;
		}